

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O3

void telnet_log(Plug *plug,PlugLogType type,SockAddr *addr,int port,char *error_msg,int error_code)

{
  backend_socket_log((Seat *)plug[-0x11].vt,(LogContext *)plug[-0x10].vt,type,addr,port,error_msg,
                     error_code,(Conf *)plug[-2].vt,*(_Bool *)&plug[-0x12].vt);
  if (type == PLUGLOG_CONNECT_SUCCESS) {
    *(undefined1 *)&plug[-0x12].vt = 1;
    if ((Ldisc *)plug[-0xf].vt != (Ldisc *)0x0) {
      ldisc_check_sendok((Ldisc *)plug[-0xf].vt);
      return;
    }
  }
  return;
}

Assistant:

static void telnet_log(Plug *plug, PlugLogType type, SockAddr *addr, int port,
                       const char *error_msg, int error_code)
{
    Telnet *telnet = container_of(plug, Telnet, plug);
    backend_socket_log(telnet->seat, telnet->logctx, type, addr, port,
                       error_msg, error_code, telnet->conf,
                       telnet->socket_connected);
    if (type == PLUGLOG_CONNECT_SUCCESS) {
        telnet->socket_connected = true;
        if (telnet->ldisc)
            ldisc_check_sendok(telnet->ldisc);
    }
}